

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O1

bool google::protobuf::compiler::cpp::anon_unknown_0::CanInitializeByZeroing(FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  EnumValueDescriptor *pEVar3;
  byte bVar4;
  
  if (*(int *)(field + 0x4c) == 3) {
    return false;
  }
  if (field[0x50] != (FieldDescriptor)0x0) {
LAB_0025f3f9:
    return false;
  }
  TVar2 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4)) {
  case 1:
  case 3:
    bVar4 = *(int *)(field + 0xa0) == 0;
    break;
  case 2:
  case 4:
    bVar4 = *(long *)(field + 0xa0) == 0;
    break;
  case 5:
    bVar1 = *(double *)(field + 0xa0) == 0.0;
    goto LAB_0025f3ec;
  case 6:
    bVar1 = *(float *)(field + 0xa0) == 0.0;
LAB_0025f3ec:
    bVar4 = -bVar1 & 1;
    break;
  case 7:
    bVar4 = (byte)field[0xa0] ^ 1;
    break;
  case 8:
    pEVar3 = FieldDescriptor::default_value_enum(field);
    bVar4 = *(int *)(pEVar3 + 0x10) == 0;
    break;
  default:
    goto LAB_0025f3f9;
  }
  return (bool)bVar4;
}

Assistant:

inline bool FieldDescriptor::is_repeated() const {
  return label() == LABEL_REPEATED;
}